

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Array * json_array_make(JSON_Value *wrapping_value)

{
  JSON_Array *new_array;
  JSON_Value *wrapping_value_local;
  
  wrapping_value_local = (JSON_Value *)(*parson_malloc)(0x20);
  if (wrapping_value_local == (JSON_Value *)0x0) {
    wrapping_value_local = (JSON_Value *)0x0;
  }
  else {
    wrapping_value_local->parent = wrapping_value;
    *(undefined8 *)&wrapping_value_local->type = 0;
    (wrapping_value_local->value).string.length = 0;
    (wrapping_value_local->value).string.chars = (char *)0x0;
  }
  return (JSON_Array *)wrapping_value_local;
}

Assistant:

static JSON_Array * json_array_make(JSON_Value *wrapping_value) {
    JSON_Array *new_array = (JSON_Array*)parson_malloc(sizeof(JSON_Array));
    if (new_array == NULL) {
        return NULL;
    }
    new_array->wrapping_value = wrapping_value;
    new_array->items = (JSON_Value**)NULL;
    new_array->capacity = 0;
    new_array->count = 0;
    return new_array;
}